

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_hash_map.hpp
# Opt level: O3

pair<ska::detailv3::sherwood_v3_table<std::pair<int,_const_slang::ast::Expression_*>,_int,_std::hash<int>,_ska::detailv3::KeyOrValueHasher<int,_std::pair<int,_const_slang::ast::Expression_*>,_std::hash<int>_>,_std::equal_to<int>,_ska::detailv3::KeyOrValueEquality<int,_std::pair<int,_const_slang::ast::Expression_*>,_std::equal_to<int>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<int,_const_slang::ast::Expression_*>_>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<int,_const_slang::ast::Expression_*>_>,_8UL>_>::templated_iterator<std::pair<int,_const_slang::ast::Expression_*>_>,_bool>
 __thiscall
ska::detailv3::
sherwood_v3_table<std::pair<int,slang::ast::Expression_const*>,int,std::hash<int>,ska::detailv3::KeyOrValueHasher<int,std::pair<int,slang::ast::Expression_const*>,std::hash<int>>,std::equal_to<int>,ska::detailv3::KeyOrValueEquality<int,std::pair<int,slang::ast::Expression_const*>,std::equal_to<int>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<int,slang::ast::Expression_const*>>,8ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<int,slang::ast::Expression_const*>>,8ul>>
::emplace<int&,slang::ast::Expression_const*>
          (sherwood_v3_table<std::pair<int,slang::ast::Expression_const*>,int,std::hash<int>,ska::detailv3::KeyOrValueHasher<int,std::pair<int,slang::ast::Expression_const*>,std::hash<int>>,std::equal_to<int>,ska::detailv3::KeyOrValueEquality<int,std::pair<int,slang::ast::Expression_const*>,std::equal_to<int>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<int,slang::ast::Expression_const*>>,8ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<int,slang::ast::Expression_const*>>,8ul>>
           *this,int *key,Expression **args)

{
  EntryPointer psVar1;
  EntryPointer psVar2;
  char distance_from_desired;
  EntryPointer current_entry;
  pair<ska::detailv3::sherwood_v3_table<std::pair<int,_const_slang::ast::Expression_*>,_int,_std::hash<int>,_ska::detailv3::KeyOrValueHasher<int,_std::pair<int,_const_slang::ast::Expression_*>,_std::hash<int>_>,_std::equal_to<int>,_ska::detailv3::KeyOrValueEquality<int,_std::pair<int,_const_slang::ast::Expression_*>,_std::equal_to<int>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<int,_const_slang::ast::Expression_*>_>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<int,_const_slang::ast::Expression_*>_>,_8UL>_>::templated_iterator<std::pair<int,_const_slang::ast::Expression_*>_>,_bool>
  pVar3;
  
  current_entry =
       (EntryPointer)
       (*(long *)(this + 8) +
       ((ulong)((long)*key * -0x61c8864680b583eb) >> ((byte)this[0x18] & 0x3f)) * 0x18);
  if (current_entry->distance_from_desired < '\0') {
    distance_from_desired = '\0';
  }
  else {
    distance_from_desired = '\0';
    psVar2 = current_entry;
    do {
      if (*key == (psVar2->field_1).value.first) {
        pVar3._8_8_ = 0;
        pVar3.first.current = psVar2;
        return pVar3;
      }
      current_entry = psVar2 + 1;
      distance_from_desired = distance_from_desired + '\x01';
      psVar1 = psVar2 + 1;
      psVar2 = current_entry;
    } while (distance_from_desired <= psVar1->distance_from_desired);
  }
  pVar3 = emplace_new_key<int&,slang::ast::Expression_const*>
                    (this,distance_from_desired,current_entry,key,args);
  return pVar3;
}

Assistant:

std::pair<iterator, bool> emplace(Key && key, Args &&... args)
    {
        size_t index = hash_policy.index_for_hash(hash_object(key), num_slots_minus_one);
        EntryPointer current_entry = entries + ptrdiff_t(index);
        int8_t distance_from_desired = 0;
        for (; current_entry->distance_from_desired >= distance_from_desired; ++current_entry, ++distance_from_desired)
        {
            if (compares_equal(key, current_entry->value))
                return { { current_entry }, false };
        }
        return emplace_new_key(distance_from_desired, current_entry, std::forward<Key>(key), std::forward<Args>(args)...);
    }